

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

void __thiscall
icu_63::number::LocalizedNumberFormatter::getAffixImpl
          (LocalizedNumberFormatter *this,bool isPrefix,bool isNegative,UnicodeString *result,
          UErrorCode *status)

{
  int32_t start;
  bool bVar1;
  int32_t limit;
  char *__filename;
  UnicodeString local_240;
  UnicodeString local_200;
  UnicodeString local_1c0;
  UnicodeString local_180;
  int32_t local_130;
  byte local_129;
  int32_t prefixLength;
  int8_t signum;
  NumberStringBuilder string;
  UErrorCode *status_local;
  UnicodeString *result_local;
  bool isNegative_local;
  bool isPrefix_local;
  LocalizedNumberFormatter *this_local;
  
  string._248_8_ = status;
  impl::NumberStringBuilder::NumberStringBuilder((NumberStringBuilder *)&prefixLength);
  local_129 = -isNegative | 1;
  bVar1 = computeCompiled(this,(UErrorCode *)string._248_8_);
  if (bVar1) {
    __filename = (char *)(ulong)(uint)(int)(char)local_129;
    local_130 = impl::NumberFormatterImpl::getPrefixSuffix
                          (this->fCompiled,local_129,OTHER,(NumberStringBuilder *)&prefixLength,
                           (UErrorCode *)string._248_8_);
  }
  else {
    __filename = (char *)(ulong)(uint)(int)(char)local_129;
    local_130 = impl::NumberFormatterImpl::getPrefixSuffixStatic
                          ((MacroProps *)this,local_129,OTHER,(NumberStringBuilder *)&prefixLength,
                           (UErrorCode *)string._248_8_);
  }
  UnicodeString::remove(result,__filename);
  if (isPrefix) {
    impl::NumberStringBuilder::toTempUnicodeString(&local_1c0,(NumberStringBuilder *)&prefixLength);
    UnicodeString::tempSubStringBetween(&local_180,&local_1c0,0,local_130);
    UnicodeString::append(result,&local_180);
    UnicodeString::~UnicodeString(&local_180);
    UnicodeString::~UnicodeString(&local_1c0);
  }
  else {
    impl::NumberStringBuilder::toTempUnicodeString(&local_240,(NumberStringBuilder *)&prefixLength);
    start = local_130;
    limit = impl::NumberStringBuilder::length((NumberStringBuilder *)&prefixLength);
    UnicodeString::tempSubStringBetween(&local_200,&local_240,start,limit);
    UnicodeString::append(result,&local_200);
    UnicodeString::~UnicodeString(&local_200);
    UnicodeString::~UnicodeString(&local_240);
  }
  impl::NumberStringBuilder::~NumberStringBuilder((NumberStringBuilder *)&prefixLength);
  return;
}

Assistant:

void LocalizedNumberFormatter::getAffixImpl(bool isPrefix, bool isNegative, UnicodeString& result,
                                            UErrorCode& status) const {
    NumberStringBuilder string;
    auto signum = static_cast<int8_t>(isNegative ? -1 : 1);
    // Always return affixes for plural form OTHER.
    static const StandardPlural::Form plural = StandardPlural::OTHER;
    int32_t prefixLength;
    if (computeCompiled(status)) {
        prefixLength = fCompiled->getPrefixSuffix(signum, plural, string, status);
    } else {
        prefixLength = NumberFormatterImpl::getPrefixSuffixStatic(fMacros, signum, plural, string, status);
    }
    result.remove();
    if (isPrefix) {
        result.append(string.toTempUnicodeString().tempSubStringBetween(0, prefixLength));
    } else {
        result.append(string.toTempUnicodeString().tempSubStringBetween(prefixLength, string.length()));
    }
}